

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O1

Mat * __thiscall
ncnn::ModelBin::load(Mat *__return_storage_ptr__,ModelBin *this,int w,int h,int d,int c,int type)

{
  Mat local_78;
  
  (*this->_vptr_ModelBin[2])(&local_78,this,(ulong)(uint)(d * c * h * w),(ulong)(uint)type);
  if ((local_78.data == (void *)0x0) || ((long)local_78.c * local_78.cstep == 0)) {
    __return_storage_ptr__->data = local_78.data;
    __return_storage_ptr__->refcount = local_78.refcount;
    __return_storage_ptr__->elemsize = local_78.elemsize;
    __return_storage_ptr__->elempack = local_78.elempack;
    __return_storage_ptr__->allocator = local_78.allocator;
    __return_storage_ptr__->dims = local_78.dims;
    __return_storage_ptr__->w = local_78.w;
    __return_storage_ptr__->h = local_78.h;
    __return_storage_ptr__->d = local_78.d;
    __return_storage_ptr__->c = local_78.c;
    __return_storage_ptr__->cstep = local_78.cstep;
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + 1;
      UNLOCK();
    }
  }
  else {
    Mat::reshape(__return_storage_ptr__,&local_78,w,h,d,c,(Allocator *)0x0);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBin::load(int w, int h, int d, int c, int type) const
{
    Mat m = load(w * h * d * c, type);
    if (m.empty())
        return m;

    return m.reshape(w, h, d, c);
}